

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

lyxml_elem * lyxml_parse_path(ly_ctx *ctx,char *filename,int options)

{
  int iVar1;
  char *local_48;
  char *addr;
  size_t sStack_38;
  int fd;
  size_t length;
  lyxml_elem *elem;
  char *pcStack_20;
  int options_local;
  char *filename_local;
  ly_ctx *ctx_local;
  
  length = 0;
  elem._4_4_ = options;
  pcStack_20 = filename;
  filename_local = (char *)ctx;
  if ((filename == (char *)0x0) || (ctx == (ly_ctx *)0x0)) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyxml_parse_path");
  }
  else {
    addr._4_4_ = open(filename,0);
    if (addr._4_4_ == -1) {
      ly_log((ly_ctx *)filename_local,LY_LLERR,LY_EINVAL,"Opening file \"%s\" failed.",pcStack_20);
    }
    else {
      iVar1 = lyp_mmap((ly_ctx *)filename_local,addr._4_4_,0,&stack0xffffffffffffffc8,&local_48);
      if (iVar1 == 0) {
        if (local_48 != (char *)0x0) {
          length = (size_t)lyxml_parse_mem((ly_ctx *)filename_local,local_48,elem._4_4_);
          lyp_munmap(local_48,sStack_38);
          close(addr._4_4_);
          return (lyxml_elem *)length;
        }
      }
      else {
        ly_log((ly_ctx *)filename_local,LY_LLERR,LY_ESYS,
               "Mapping file descriptor into memory failed (%s()).","lyxml_parse_path");
      }
      if (addr._4_4_ != -1) {
        close(addr._4_4_);
      }
    }
  }
  return (lyxml_elem *)0x0;
}

Assistant:

lyxml_elem *
lyxml_parse_path(struct ly_ctx *ctx, const char *filename, int options)
{
    struct lyxml_elem *elem = NULL;
    size_t length;
    int fd;
    char *addr;

    if (!filename || !ctx) {
        LOGARG;
        return NULL;
    }

    fd = open(filename, O_RDONLY);
    if (fd == -1) {
        LOGERR(ctx, LY_EINVAL,"Opening file \"%s\" failed.", filename);
        return NULL;
    }
    if (lyp_mmap(ctx, fd, 0, &length, (void **)&addr)) {
        LOGERR(ctx, LY_ESYS, "Mapping file descriptor into memory failed (%s()).", __func__);
        goto error;
    } else if (!addr) {
        /* empty XML file */
        goto error;
    }

    elem = lyxml_parse_mem(ctx, addr, options);
    lyp_munmap(addr, length);
    close(fd);

    return elem;

error:
    if (fd != -1) {
        close(fd);
    }

    return NULL;
}